

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void __thiscall
wasm::Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::
walkFunctionInModule
          (Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_> *this,
          Function *func,Module *module)

{
  I64ToI32Lowering *this_00;
  
  this->currModule = module;
  this->currFunction = func;
  this_00 = (I64ToI32Lowering *)(this[-1].stack.fixed._M_elems + 7);
  I64ToI32Lowering::doWalkFunction(this_00,func);
  I64ToI32Lowering::visitFunction(this_00,func);
  this->currFunction = (Function *)0x0;
  this->currModule = (Module *)0x0;
  return;
}

Assistant:

void walkFunctionInModule(Function* func, Module* module) {
    setModule(module);
    setFunction(func);
    static_cast<SubType*>(this)->doWalkFunction(func);
    static_cast<SubType*>(this)->visitFunction(func);
    setFunction(nullptr);
    setModule(nullptr);
  }